

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_compress.c
# Opt level: O3

int archive_compressor_compress_close(archive_write_filter *f)

{
  void *__ptr;
  void *pvVar1;
  int iVar2;
  int iVar3;
  
  __ptr = f->data;
  iVar2 = output_code(f,*(int *)((long)__ptr + 0x65164));
  if (iVar2 == 0) {
    pvVar1 = f->data;
    iVar2 = *(int *)((long)pvVar1 + 0x6516c) % 8;
    if (iVar2 != 0) {
      *(uint *)((long)pvVar1 + 0x18) = iVar2 + 7U >> 3;
      iVar2 = output_byte(f,*(uchar *)((long)pvVar1 + 0x65170));
      if (iVar2 != 0) goto LAB_0016e0c1;
    }
    iVar2 = __archive_write_filter
                      (f->next_filter,*(void **)((long)__ptr + 0x65178),
                       *(size_t *)((long)__ptr + 0x65188));
  }
LAB_0016e0c1:
  iVar3 = __archive_write_close_filter(f->next_filter);
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  free(*(void **)((long)__ptr + 0x65178));
  free(__ptr);
  return iVar3;
}

Assistant:

static int
archive_compressor_compress_close(struct archive_write_filter *f)
{
	struct private_data *state = (struct private_data *)f->data;
	int ret, ret2;

	ret = output_code(f, state->cur_code);
	if (ret != ARCHIVE_OK)
		goto cleanup;
	ret = output_flush(f);
	if (ret != ARCHIVE_OK)
		goto cleanup;

	/* Write the last block */
	ret = __archive_write_filter(f->next_filter,
	    state->compressed, state->compressed_offset);
cleanup:
	ret2 = __archive_write_close_filter(f->next_filter);
	if (ret > ret2)
		ret = ret2;
	free(state->compressed);
	free(state);
	return (ret);
}